

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

double * getMODWTmra(wt_object wt,double *wavecoeffs)

{
  int N_00;
  int iVar1;
  int iVar2;
  int iVar3;
  fft_object obj;
  fft_object fft_bd_00;
  fft_data *inp;
  fft_data *cA_00;
  fft_data *cD_00;
  fft_data *det;
  fft_data *oup;
  fft_data *oup_00;
  int *index_00;
  double *pdVar4;
  double dVar5;
  fft_object fft_bd;
  fft_object fft_fd;
  int *index;
  fft_data *ninp;
  fft_data *sig;
  fft_data *high_pass;
  fft_data *low_pass;
  fft_data *cD;
  fft_data *cA;
  double s;
  int local_60;
  int lenacc;
  int lmra;
  int len_avg;
  int N;
  int M;
  int iter;
  int temp_len;
  int J;
  int i;
  double *mra;
  double *wavecoeffs_local;
  wt_object wt_local;
  
  N_00 = wt->modwtsiglength;
  iVar1 = wt->wave->lpd_len;
  iVar3 = strcmp(wt->ext,"sym");
  if (iVar3 == 0) {
    M = N_00 / 2;
  }
  else {
    iVar3 = strcmp(wt->ext,"per");
    if (iVar3 == 0) {
      M = N_00;
    }
  }
  iVar3 = wt->J;
  dVar5 = sqrt(2.0);
  obj = fft_init(N_00,1);
  fft_bd_00 = fft_init(N_00,-1);
  inp = (fft_data *)malloc((long)N_00 << 4);
  cA_00 = (fft_data *)malloc((long)N_00 << 4);
  cD_00 = (fft_data *)malloc((long)N_00 << 4);
  det = (fft_data *)malloc((long)N_00 << 4);
  oup = (fft_data *)malloc((long)N_00 << 4);
  oup_00 = (fft_data *)malloc((long)N_00 << 4);
  index_00 = (int *)malloc((long)N_00 << 2);
  pdVar4 = (double *)malloc((long)M * 8 * (long)(iVar3 + 1));
  for (temp_len = 0; iVar2 = iVar1, temp_len < iVar1; temp_len = temp_len + 1) {
    inp[temp_len].re = wt->wave->lpd[temp_len] / dVar5;
    inp[temp_len].im = 0.0;
  }
  while (temp_len = iVar2, temp_len < N_00) {
    inp[temp_len].re = 0.0;
    inp[temp_len].im = 0.0;
    iVar2 = temp_len + 1;
  }
  fft_exec(obj,inp,oup);
  for (temp_len = 0; temp_len < iVar1; temp_len = temp_len + 1) {
    inp[temp_len].re = wt->wave->hpd[temp_len] / dVar5;
    inp[temp_len].im = 0.0;
  }
  while (temp_len = iVar1, temp_len < N_00) {
    inp[temp_len].re = 0.0;
    inp[temp_len].im = 0.0;
    iVar1 = temp_len + 1;
  }
  fft_exec(obj,inp,oup_00);
  conj_complex(oup,N_00);
  conj_complex(oup_00,N_00);
  pow(2.0,(double)iVar3 - 1.0);
  for (temp_len = 0; temp_len < N_00; temp_len = temp_len + 1) {
    inp[temp_len].re = wt->output[temp_len];
    inp[temp_len].im = 0.0;
    det[temp_len].re = 0.0;
    det[temp_len].im = 0.0;
  }
  getMODWTRecCoeff(obj,fft_bd_00,inp,det,cA_00,cD_00,index_00,"appx",iVar3,iVar3,oup,oup_00,N_00);
  for (temp_len = 0; temp_len < wt->siglength; temp_len = temp_len + 1) {
    pdVar4[temp_len] = inp[temp_len].re;
  }
  local_60 = wt->siglength;
  s._4_4_ = N_00;
  for (N = 0; N < iVar3; N = N + 1) {
    for (temp_len = 0; temp_len < N_00; temp_len = temp_len + 1) {
      inp[temp_len].re = wt->output[s._4_4_ + temp_len];
      inp[temp_len].im = 0.0;
      det[temp_len].re = 0.0;
      det[temp_len].im = 0.0;
    }
    getMODWTRecCoeff(obj,fft_bd_00,inp,det,cA_00,cD_00,index_00,"det",iVar3 - N,iVar3,oup,oup_00,
                     N_00);
    for (temp_len = 0; temp_len < wt->siglength; temp_len = temp_len + 1) {
      pdVar4[local_60 + temp_len] = inp[temp_len].re;
    }
    s._4_4_ = N_00 + s._4_4_;
    local_60 = wt->siglength + local_60;
  }
  free(det);
  free(index_00);
  free(inp);
  free(cA_00);
  free(cD_00);
  free(oup);
  free(oup_00);
  free_fft(obj);
  free_fft(fft_bd_00);
  return pdVar4;
}

Assistant:

double* getMODWTmra(wt_object wt, double *wavecoeffs) {
	double *mra;
	int i, J, temp_len, iter, M, N, len_avg,lmra;
	int lenacc;
	double s;
	fft_data  *cA, *cD, *low_pass, *high_pass, *sig,*ninp;
	int *index;
	fft_object fft_fd = NULL;
	fft_object fft_bd = NULL;

	N = wt->modwtsiglength;
	len_avg = wt->wave->lpd_len;
	if (!strcmp(wt->ext, "sym")) {
		temp_len = N / 2;
	}
	else if (!strcmp(wt->ext, "per")) {
		temp_len = N;
	}
	J = wt->J;

	s = sqrt(2.0);
	fft_fd = fft_init(N, 1);
	fft_bd = fft_init(N, -1);

	sig = (fft_data*)malloc(sizeof(fft_data)* N);
	cA = (fft_data*)malloc(sizeof(fft_data)* N);
	cD = (fft_data*)malloc(sizeof(fft_data)* N);
	ninp = (fft_data*)malloc(sizeof(fft_data)* N);
	low_pass = (fft_data*)malloc(sizeof(fft_data)* N);
	high_pass = (fft_data*)malloc(sizeof(fft_data)* N);
	index = (int*)malloc(sizeof(int)*N);
	mra = (double*)malloc(sizeof(double)*temp_len*(J + 1));

	// N-point FFT of low pass and high pass filters

	// Low Pass Filter

	for (i = 0; i < len_avg; ++i) {
		sig[i].re = (fft_type)wt->wave->lpd[i] / s;
		sig[i].im = 0.0;
	}
	for (i = len_avg; i < N; ++i) {
		sig[i].re = 0.0;
		sig[i].im = 0.0;
	}


	fft_exec(fft_fd, sig, low_pass);

	// High Pass Filter

	for (i = 0; i < len_avg; ++i) {
		sig[i].re = (fft_type)wt->wave->hpd[i] / s;
		sig[i].im = 0.0;
	}
	for (i = len_avg; i < N; ++i) {
		sig[i].re = 0.0;
		sig[i].im = 0.0;
	}

	fft_exec(fft_fd, sig, high_pass);


	// Complex conjugate of the two filters

	conj_complex(low_pass, N);
	conj_complex(high_pass, N);

	M = (int)pow(2.0, (double)J - 1.0);
	lenacc = N;

	// 
	for (i = 0; i < N; ++i) {
		sig[i].re = (fft_type)wt->output[i];
		sig[i].im = 0.0;
		ninp[i].re = 0.0;
		ninp[i].im = 0.0;
	}

	// Find Approximation MRA

	getMODWTRecCoeff(fft_fd,fft_bd,sig,ninp,cA,cD,index,"appx",J,J,low_pass,high_pass,N);

	for (i = 0; i < wt->siglength; ++i) {
		mra[i] = sig[i].re;
	}
	lmra = wt->siglength;
	// Find Details MRA

	for (iter = 0; iter < J; ++iter) {
		for (i = 0; i < N; ++i) {
			sig[i].re = (fft_type)wt->output[lenacc+i];
			sig[i].im = 0.0;
			ninp[i].re = 0.0;
			ninp[i].im = 0.0;
		}

		getMODWTRecCoeff(fft_fd, fft_bd, sig, ninp,cA, cD, index, "det", J-iter, J, low_pass, high_pass, N);

		for (i = 0; i < wt->siglength; ++i) {
			mra[lmra+i] = sig[i].re;
		}

		lenacc += N;
		lmra += wt->siglength;
	}

	free(ninp);
	free(index);
	free(sig);
	free(cA);
	free(cD);
	free(low_pass);
	free(high_pass);
	free_fft(fft_fd);
	free_fft(fft_bd);

	return mra;
}